

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indlg_tx.c
# Opt level: O3

int tio_input_dialog(int icon_id,char *prompt,int standard_button_set,char **buttons,
                    int button_count,int default_index,int cancel_index)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ushort **ppuVar5;
  size_t sVar6;
  __int32_t **pp_Var7;
  long lVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte bVar11;
  ulong uVar12;
  char *pcVar13;
  uint uVar15;
  byte bVar16;
  byte *__s;
  char buf [256];
  char **local_170;
  int local_164;
  byte local_138;
  byte local_137 [263];
  char *pcVar14;
  
  local_170 = buttons;
  do {
    do {
      __s = &local_138;
      iVar4 = 0;
      switch(standard_button_set) {
      case 0:
        goto switchD_00213c2d_caseD_0;
      case 1:
        iVar4 = 0;
        break;
      case 2:
        iVar4 = 1;
        break;
      case 3:
        iVar4 = 2;
        break;
      case 4:
        iVar4 = 3;
        break;
      default:
        goto switchD_00213c2d_default;
      }
      local_170 = (char **)((long)tio_input_dialog::std_btns[0].buttons + (ulong)(uint)(iVar4 << 5))
      ;
      button_count = *(uint *)((long)tio_input_dialog::std_btns[0].buttons +
                              (ulong)(uint)(iVar4 << 5) + 0x18);
switchD_00213c2d_caseD_0:
      if (button_count == 0) {
        return 0;
      }
      outformat("\\n");
      outformat(prompt);
      outformat(" ");
      if (0 < button_count) {
        uVar12 = 0;
        do {
          if (uVar12 != 0) {
            outformat("/");
          }
          pbVar9 = (byte *)local_170[uVar12];
          for (lVar8 = 0; pbVar9[lVar8] != 0; lVar8 = lVar8 + 1) {
            if (pbVar9[lVar8] == 0x26) {
              sprintf((char *)__s,"%.*s(%c)%s",lVar8,pbVar9,
                      (ulong)(uint)(int)(char)pbVar9[lVar8 + 1]);
              pbVar9 = __s;
              break;
            }
          }
          outformat((char *)pbVar9);
          uVar12 = uVar12 + 1;
        } while (uVar12 != (uint)button_count);
      }
      iVar4 = tio_is_html_mode();
      if (iVar4 != 0) {
        outformat("<font face=\'TADS-Input\'>");
      }
      getstring(" >",(char *)__s,0x100);
      iVar4 = tio_is_html_mode();
      if (iVar4 != 0) {
        outformat("</font>");
      }
      bVar16 = local_138;
      if (-1 < (char)local_138) {
        ppuVar5 = __ctype_b_loc();
        do {
          if ((*(byte *)((long)*ppuVar5 + (ulong)bVar16 * 2 + 1) & 0x20) == 0) break;
          bVar16 = __s[1];
          __s = __s + 1;
        } while (-1 < (char)bVar16);
      }
      sVar6 = strlen((char *)__s);
      if ((sVar6 == 1) && (0 < button_count)) {
        uVar12 = 0;
        do {
          pcVar14 = local_170[uVar12];
          do {
            pcVar13 = pcVar14 + 1;
            cVar1 = *pcVar14;
            if (cVar1 == '\0') goto LAB_00213dbc;
            pcVar14 = pcVar13;
          } while (cVar1 != '&');
          pp_Var7 = __ctype_toupper_loc();
          if ((*pp_Var7)[*pcVar13] == (*pp_Var7)[(char)bVar16]) {
            return (int)uVar12 + 1;
          }
LAB_00213dbc:
          uVar12 = uVar12 + 1;
        } while (uVar12 != (uint)button_count);
      }
    } while (button_count < 1);
    uVar12 = 0;
    iVar4 = 0;
    do {
      uVar15 = 1;
      iVar3 = (int)uVar12;
      if (bVar16 != 0) {
        pbVar9 = (byte *)local_170[uVar12];
        pbVar10 = __s;
        bVar11 = bVar16;
        do {
          pbVar10 = pbVar10 + 1;
          bVar2 = *pbVar9;
          uVar15 = (uint)bVar2;
          iVar3 = local_164;
          if (bVar2 == 0x26) {
            bVar2 = pbVar9[1];
            pbVar9 = pbVar9 + 1;
          }
          else if (bVar2 == 0) goto LAB_00213e9a;
          pp_Var7 = __ctype_toupper_loc();
          if ((*pp_Var7)[(char)bVar11] != (*pp_Var7)[(char)bVar2]) {
            uVar15 = 0;
            goto LAB_00213e9a;
          }
          pbVar9 = pbVar9 + 1;
          bVar11 = *pbVar10;
        } while (bVar11 != 0);
        uVar15 = 1;
        iVar3 = (int)uVar12;
      }
LAB_00213e9a:
      local_164 = iVar3;
      iVar4 = iVar4 + uVar15;
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uint)button_count);
  } while (iVar4 != 1);
  iVar4 = local_164 + 1;
switchD_00213c2d_default:
  return iVar4;
}

Assistant:

int tio_input_dialog(int icon_id, const char *prompt,
                     int standard_button_set,
                     const char **buttons, int button_count,
                     int default_index, int cancel_index)
{
    /* ignore the icon ID - we can't display an icon in text mode */
    VARUSED(icon_id);

    /* keep going until we get a valid response */
    for (;;)
    {
        int i;
        char buf[256];
        const char *p;
        const char *cur;
        char *resp;
        int match_cnt;
        int last_found;
        static const struct
        {
            const char *buttons[3];
            int button_count;
        } std_btns[] =
        {
            { { "&OK" },                    1 },
            { { "&OK", "&Cancel" },         2 },
            { { "&Yes", "&No" },            2 },
            { { "&Yes", "&No", "&Cancel" }, 3 }
        };

        /* 
         *   if we have a standard button set selected, get our button
         *   labels 
         */
        switch(standard_button_set)
        {
        case 0:
            /* use the explicit buttons provided */
            break;

        case OS_INDLG_OK:
            i = 0;

        use_std_btns:
            /* use the selected standard button set */
            buttons = (const char **)std_btns[i].buttons;
            button_count = std_btns[i].button_count;
            break;

        case OS_INDLG_OKCANCEL:
            i = 1;
            goto use_std_btns;

        case OS_INDLG_YESNO:
            i = 2;
            goto use_std_btns;

        case OS_INDLG_YESNOCANCEL:
            i = 3;
            goto use_std_btns;

        default:
            /* 
             *   we don't recognize other standard button sets - return an
             *   error 
             */
            return 0;
        }

        /* 
         *   if there are no buttons defined, they'll never be able to
         *   respond, so we'd just loop forever - rather than let that
         *   happen, return failure 
         */
        if (button_count == 0)
            return 0;

        /* display a newline and the prompt string */
        outformat("\\n");
        outformat((char *)prompt);
        outformat(" ");

        /* display the response */
        for (i = 0 ; i < button_count ; ++i)
        {
            /* 
             *   display a slash to separate responses, if this isn't the
             *   first one 
             */
            if (i != 0)
                outformat("/");

            /* get the current button */
            cur = buttons[i];

            /* 
             *   Look for a "&" in the response string.  If we find it,
             *   remove the "&" and enclose the shortcut key in parens.  
             */
            for (p = cur ; *p != '&' && *p != '\0' ; ++p) ;

            /* if we found the "&", put the next character in parens */
            if (*p == '&')
            {
                /* reformat the response string */
                sprintf(buf, "%.*s(%c)%s", (int)(p - cur), cur, *(p+1), p+2);

                /* display it */
                outformat(buf);
            }
            else
            {
                /* no '&' - just display the response string as-is */
                outformat((char *)cur);
            }
        }

        /* if we're in HTML mode, switch to input font */
        if (tio_is_html_mode())
            outformat("<font face='TADS-Input'>");

        /* read the response */
        getstring(" >", buf, sizeof(buf));

        /* if we're in HTML mode, close the input font tag */
        if (tio_is_html_mode())
            outformat("</font>");

        /* skip any leading spaces in the reply */
        for (resp = buf ; t_isspace(*resp) ; ++resp) ;

        /* if it's one character, check it against the shortcut keys */
        if (strlen(resp) == 1)
        {
            /* scan the responses */
            for (i = 0 ; i < button_count ; ++i)
            {
                /* look for a '&' in this button */
                for (p = buttons[i] ; *p != '&' && *p != '\0' ; ++p) ;

                /* if we found the '&', check the shortcut */
                if (*p == '&' && toupper(*(p+1)) == toupper(*resp))
                {
                    /* 
                     *   this is the one - return the current index
                     *   (bumping it by one to get a 1-based value) 
                     */
                    return i + 1;
                }
            }
        }

        /* 
         *   Either it's not a one-character reply, or it didn't match a
         *   short-cut - check it against the leading substrings of the
         *   responses.  If it matches exactly one of the responses in its
         *   leading substring, use that response.  
         */
        for (i = 0, match_cnt = 0 ; i < button_count ; ++i)
        {
            const char *p1;
            const char *p2;

            /* 
             *   compare this response to the user's response; skip any
             *   '&' in the button label 
             */
            for (p1 = resp, p2 = buttons[i] ; *p1 != '\0' && *p2 != '\0' ;
                 ++p1, ++p2)
            {
                /* if this is a '&' in the button label, skip it */
                if (*p2 == '&')
                    ++p2;

                /* if these characters don't match, it's no match */
                if (toupper(*p1) != toupper(*p2))
                    break;
            }

            /* 
             *   if we reached the end of the user's response, we have a
             *   match in the leading substring - count it and remember
             *   this as the last one, but keep looking, since we need to
             *   make sure we don't have any other matches 
             */
            if (*p1 == '\0')
            {
                ++match_cnt;
                last_found = i;
            }
        }
        
        /* 
         *   if we found exactly one match, return it (adjusting to a
         *   1-based index); if we found more or less than one match, it's
         *   not a valid response, so start over with a new prompt 
         */
        if (match_cnt == 1)
            return last_found + 1;
    }
}